

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O3

spvc_result
spvc_resources_get_builtin_resource_list_for_type
          (spvc_resources resources,spvc_builtin_resource_type type,
          spvc_reflected_builtin_resource **resource_list,size_t *resource_size)

{
  spvc_context this;
  long lVar1;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  if (type == SPVC_BUILTIN_RESOURCE_TYPE_STAGE_INPUT) {
    lVar1 = 0xbe0;
  }
  else {
    if (type != SPVC_BUILTIN_RESOURCE_TYPE_STAGE_OUTPUT) {
      this = resources->context;
      local_38[0] = local_28;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"Invalid argument.","");
      std::__cxx11::string::operator=((string *)this,(string *)local_38);
      if (this->callback != (spvc_error_callback)0x0) {
        (*this->callback)(this->callback_userdata,(this->last_error)._M_dataplus._M_p);
      }
      if (local_38[0] == local_28) {
        return SPVC_ERROR_INVALID_ARGUMENT;
      }
      operator_delete(local_38[0]);
      return SPVC_ERROR_INVALID_ARGUMENT;
    }
    lVar1 = 0xcf8;
  }
  *resource_size =
       *(size_t *)((resources->uniform_buffers).stack_storage.aligned_char + lVar1 + -0x20);
  *resource_list =
       *(spvc_reflected_builtin_resource **)
        ((resources->uniform_buffers).stack_storage.aligned_char + lVar1 + -0x28);
  return SPVC_SUCCESS;
}

Assistant:

spvc_result spvc_resources_get_builtin_resource_list_for_type(
		spvc_resources resources, spvc_builtin_resource_type type,
		const spvc_reflected_builtin_resource **resource_list,
		size_t *resource_size)
{
	const SmallVector<spvc_reflected_builtin_resource> *list = nullptr;
	switch (type)
	{
	case SPVC_BUILTIN_RESOURCE_TYPE_STAGE_INPUT:
		list = &resources->builtin_inputs;
		break;

	case SPVC_BUILTIN_RESOURCE_TYPE_STAGE_OUTPUT:
		list = &resources->builtin_outputs;
		break;

	default:
		break;
	}

	if (!list)
	{
		resources->context->report_error("Invalid argument.");
		return SPVC_ERROR_INVALID_ARGUMENT;
	}

	*resource_size = list->size();
	*resource_list = list->data();
	return SPVC_SUCCESS;
}